

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O0

AMQP_VALUE messaging_delivery_received(uint32_t section_number,uint64_t section_offset)

{
  RECEIVED_HANDLE received_00;
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  RECEIVED_HANDLE received;
  AMQP_VALUE result;
  uint64_t section_offset_local;
  uint32_t section_number_local;
  
  received_00 = received_create(section_number,section_offset);
  if (received_00 == (RECEIVED_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_delivery_received",0x6f,1,"Cannot create RECEIVED delivery state handle"
               );
    }
    received = (RECEIVED_HANDLE)0x0;
  }
  else {
    received = (RECEIVED_HANDLE)amqpvalue_create_received(received_00);
    if (((AMQP_VALUE)received == (AMQP_VALUE)0x0) &&
       (p_Var1 = xlogging_get_log_function(), p_Var1 != (LOGGER_LOG)0x0)) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_delivery_received",0x77,1,
                "Cannot create RECEIVED delivery state AMQP value");
    }
    received_destroy(received_00);
  }
  return (AMQP_VALUE)received;
}

Assistant:

AMQP_VALUE messaging_delivery_received(uint32_t section_number, uint64_t section_offset)
{
    AMQP_VALUE result;
    RECEIVED_HANDLE received = received_create(section_number, section_offset);
    if (received == NULL)
    {
        LogError("Cannot create RECEIVED delivery state handle");
        result = NULL;
    }
    else
    {
        result = amqpvalue_create_received(received);
        if (result == NULL)
        {
            LogError("Cannot create RECEIVED delivery state AMQP value");
        }
        else
        {
            /* all ok */
        }

        received_destroy(received);
    }

    return result;
}